

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O3

LY_ERR lys_compile_feature_iffeatures(lysp_module *pmod)

{
  lysp_feature ***ppplVar1;
  ly_ctx *ctx;
  lyd_node *plVar2;
  lyd_node *plVar3;
  long lVar4;
  LY_ERR LVar5;
  lysp_feature *last;
  long *plVar6;
  ulong uVar7;
  lysc_iffeature *plVar8;
  undefined8 *puVar9;
  lysp_feature **pplVar10;
  void *pvVar11;
  size_t __n;
  lysp_feature *plVar12;
  lysp_feature *plVar13;
  void *pvVar14;
  long lVar15;
  lysp_feature *plVar16;
  lysp_feature **pplVar17;
  long lVar18;
  lysp_qname *plVar19;
  ulong uVar20;
  uint32_t idx;
  ly_set local_68;
  uint32_t local_54;
  lysp_feature *local_50;
  lysp_feature **local_48;
  ly_ctx *local_40;
  long local_38;
  
  local_54 = 0;
  last = lysp_feature_next((lysp_feature *)0x0,pmod,&local_54);
  do {
    if (last == (lysp_feature *)0x0) {
      return LY_SUCCESS;
    }
    plVar19 = last->iffeatures;
    if (plVar19 != (lysp_qname *)0x0) {
      plVar8 = last->iffeatures_c;
      if (plVar8 == (lysc_iffeature *)0x0) {
        plVar6 = (long *)calloc(1,*(long *)&plVar19[-1].flags << 4 | 8);
        if (plVar6 == (long *)0x0) goto LAB_0015442c;
        last->iffeatures_c = (lysc_iffeature *)(plVar6 + 1);
        plVar6 = plVar6 + *plVar6 * 2 + 1;
LAB_00154175:
        __n = *(long *)&plVar19[-1].flags << 4;
      }
      else {
        plVar6 = (long *)realloc(&plVar8[-1].features,
                                 (*(long *)&plVar19[-1].flags + (long)plVar8[-1].features) * 0x10 |
                                 8);
        if (plVar6 == (long *)0x0) {
LAB_0015442c:
          ly_log(pmod->mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_feature_iffeatures");
          return LY_EMEM;
        }
        plVar19 = last->iffeatures;
        last->iffeatures_c = (lysc_iffeature *)(plVar6 + 1);
        plVar6 = plVar6 + *plVar6 * 2 + 1;
        if (plVar19 != (lysp_qname *)0x0) goto LAB_00154175;
        __n = 0;
      }
      memset(plVar6,0,__n);
      uVar20 = 0xffffffffffffffff;
      lVar15 = 0;
      lVar18 = 0;
      while( true ) {
        plVar19 = last->iffeatures;
        if (plVar19 == (lysp_qname *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = *(ulong *)&plVar19[-1].flags;
        }
        uVar20 = uVar20 + 1;
        if (uVar7 <= uVar20) break;
        plVar8 = last->iffeatures_c;
        ppplVar1 = &plVar8[-1].features;
        *ppplVar1 = (lysp_feature **)((long)*ppplVar1 + 1);
        plVar19 = (lysp_qname *)((long)&plVar19->str + lVar18);
        lVar18 = lVar18 + 0x18;
        plVar8 = (lysc_iffeature *)((long)&plVar8->expr + lVar15);
        lVar15 = lVar15 + 0x10;
        LVar5 = lys_compile_iffeature(pmod->mod->ctx,plVar19,plVar8);
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
      }
      plVar8 = last->iffeatures_c;
      pplVar17 = (lysp_feature **)0x0;
      while( true ) {
        if (plVar8 == (lysc_iffeature *)0x0) {
          pplVar10 = (lysp_feature **)0x0;
        }
        else {
          pplVar10 = plVar8[-1].features;
        }
        if (pplVar10 <= pplVar17) break;
        plVar13 = (lysp_feature *)0x0;
        while( true ) {
          lVar15 = (long)pplVar17 * 0x10;
          pplVar10 = plVar8[(long)pplVar17].features;
          if (pplVar10 == (lysp_feature **)0x0) {
            plVar12 = (lysp_feature *)0x0;
          }
          else {
            plVar12 = pplVar10[-1];
          }
          if (plVar12 <= plVar13) break;
          plVar12 = pplVar10[(long)plVar13];
          ctx = pmod->mod->ctx;
          local_38 = lVar15;
          if (last == plVar12) {
            ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Feature \"%s\" is referenced from itself.",
                    last->name);
            return LY_EVALID;
          }
          pplVar10 = last->depfeatures;
          local_68.size = 0;
          local_68.count = 0;
          local_68.field_2.dnodes = (lyd_node **)0x0;
          if (pplVar10 != (lysp_feature **)0x0) {
            local_40 = ctx;
            if (pplVar10[-1] != (lysp_feature *)0x0) {
              plVar16 = (lysp_feature *)0x0;
              local_50 = plVar13;
              local_48 = pplVar17;
              do {
                if (pplVar10[(long)plVar16] == plVar12) {
LAB_001543c3:
                  ly_vlog(local_40,(char *)0x0,LYVE_REFERENCE,
                          "Feature \"%s\" is indirectly referenced from itself.",plVar12->name);
                  LVar5 = LY_EVALID;
LAB_001543ea:
                  ly_set_erase(&local_68,(_func_void_void_ptr *)0x0);
                  return LVar5;
                }
                LVar5 = ly_set_add(&local_68,pplVar10[(long)plVar16],'\0',(uint32_t *)0x0);
                if (LVar5 != LY_SUCCESS) goto LAB_001543ea;
                plVar16 = (lysp_feature *)((long)&plVar16->name + 1);
              } while (plVar16 < pplVar10[-1]);
              plVar13 = local_50;
              pplVar17 = local_48;
              if (local_68.count != 0) {
                uVar20 = 0;
                do {
                  plVar2 = local_68.field_2.dnodes[uVar20];
                  pvVar14 = (void *)0x0;
                  while( true ) {
                    plVar3 = plVar2->next;
                    if (plVar3 == (lyd_node *)0x0) {
                      pvVar11 = (void *)0x0;
                    }
                    else {
                      pvVar11 = plVar3[-1].priv;
                    }
                    if (pvVar11 <= pvVar14) break;
                    if (*(lysp_feature **)(&plVar3->hash + (long)pvVar14 * 2) == plVar12)
                    goto LAB_001543c3;
                    ly_set_add(&local_68,*(lysp_feature **)(&plVar3->hash + (long)pvVar14 * 2),'\0',
                               (uint32_t *)0x0);
                    pvVar14 = (void *)((long)pvVar14 + 1);
                  }
                  uVar20 = uVar20 + 1;
                  plVar13 = local_50;
                  pplVar17 = local_48;
                } while (uVar20 < (ulong)local_68._0_8_ >> 0x20);
              }
            }
            ly_set_erase(&local_68,(_func_void_void_ptr *)0x0);
            plVar8 = last->iffeatures_c;
          }
          lVar4 = local_38;
          lVar18 = *(long *)(*(long *)((long)&plVar8->features + local_38) + (long)plVar13 * 8);
          lVar15 = *(long *)(lVar18 + 0x18);
          if (lVar15 == 0) {
            puVar9 = (undefined8 *)malloc(0x10);
            if (puVar9 == (undefined8 *)0x0) goto LAB_0015442c;
            *puVar9 = 1;
          }
          else {
            lVar18 = *(long *)(lVar15 + -8);
            *(long *)(lVar15 + -8) = lVar18 + 1;
            puVar9 = (undefined8 *)realloc((void *)(lVar15 + -8),lVar18 * 8 + 0x10);
            lVar18 = *(long *)(*(long *)((long)&last->iffeatures_c->features + lVar4) +
                              (long)plVar13 * 8);
            if (puVar9 == (undefined8 *)0x0) {
              plVar6 = (long *)(*(long *)(lVar18 + 0x18) + -8);
              *plVar6 = *plVar6 + -1;
              goto LAB_0015442c;
            }
          }
          *(undefined8 **)(lVar18 + 0x18) = puVar9 + 1;
          lVar15 = *(long *)(*(long *)(*(long *)((long)&last->iffeatures_c->features + lVar4) +
                                      (long)plVar13 * 8) + 0x18);
          *(lysp_feature **)(lVar15 + -8 + *(long *)(lVar15 + -8) * 8) = last;
          plVar13 = (lysp_feature *)((long)&plVar13->name + 1);
          plVar8 = last->iffeatures_c;
        }
        pplVar17 = (lysp_feature **)((long)pplVar17 + 1);
      }
    }
    last = lysp_feature_next(last,pmod,&local_54);
  } while( true );
}

Assistant:

LY_ERR
lys_compile_feature_iffeatures(struct lysp_module *pmod)
{
    LY_ARRAY_COUNT_TYPE u, v;
    struct lysp_feature *f = NULL, **df;
    uint32_t idx = 0;

    while ((f = lysp_feature_next(f, pmod, &idx))) {
        if (!f->iffeatures) {
            continue;
        }

        /* compile if-features */
        LY_ARRAY_CREATE_RET(pmod->mod->ctx, f->iffeatures_c, LY_ARRAY_COUNT(f->iffeatures), LY_EMEM);
        LY_ARRAY_FOR(f->iffeatures, u) {
            LY_ARRAY_INCREMENT(f->iffeatures_c);
            LY_CHECK_RET(lys_compile_iffeature(pmod->mod->ctx, &(f->iffeatures)[u], &(f->iffeatures_c)[u]));
        }
        LY_ARRAY_FOR(f->iffeatures_c, u) {
            LY_ARRAY_FOR(f->iffeatures_c[u].features, v) {
                /* check for circular dependency - direct reference first,... */
                if (f == f->iffeatures_c[u].features[v]) {
                    LOGVAL(pmod->mod->ctx, LYVE_REFERENCE, "Feature \"%s\" is referenced from itself.", f->name);
                    return LY_EVALID;
                }
                /* ... and indirect circular reference */
                LY_CHECK_RET(lys_compile_feature_circular_check(pmod->mod->ctx, f->iffeatures_c[u].features[v], f->depfeatures));

                /* add itself into the dependants list */
                LY_ARRAY_NEW_RET(pmod->mod->ctx, f->iffeatures_c[u].features[v]->depfeatures, df, LY_EMEM);
                *df = f;
            }
        }
    }

    return LY_SUCCESS;
}